

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * sqlite3KeyInfoFromExprList(Parse *pParse,ExprList *pList,int iStart,int nExtra)

{
  int iVar1;
  int iVar2;
  KeyInfo *pKVar3;
  CollSeq *pCVar4;
  int in_EDX;
  int *in_RSI;
  undefined8 *in_RDI;
  int i;
  sqlite3 *db;
  ExprList_item *pItem;
  KeyInfo *pInfo;
  int nExpr;
  Expr *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int *local_30;
  
  iVar1 = *in_RSI;
  pKVar3 = sqlite3KeyInfoAlloc((sqlite3 *)*in_RDI,-0x55555556,in_stack_ffffffffffffffc0);
  if (pKVar3 != (KeyInfo *)0x0) {
    local_30 = in_RSI + (long)in_EDX * 6 + 2;
    for (iVar2 = in_EDX; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      pCVar4 = sqlite3ExprNNCollSeq
                         ((Parse *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      pKVar3->aColl[iVar2 - in_EDX] = pCVar4;
      pKVar3->aSortFlags[iVar2 - in_EDX] = (u8)local_30[4];
      local_30 = local_30 + 6;
    }
  }
  return pKVar3;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoFromExprList(
  Parse *pParse,       /* Parsing context */
  ExprList *pList,     /* Form the KeyInfo object from this ExprList */
  int iStart,          /* Begin with this column of pList */
  int nExtra           /* Add this many extra columns to the end */
){
  int nExpr;
  KeyInfo *pInfo;
  struct ExprList_item *pItem;
  sqlite3 *db = pParse->db;
  int i;

  nExpr = pList->nExpr;
  pInfo = sqlite3KeyInfoAlloc(db, nExpr-iStart, nExtra+1);
  if( pInfo ){
    assert( sqlite3KeyInfoIsWriteable(pInfo) );
    for(i=iStart, pItem=pList->a+iStart; i<nExpr; i++, pItem++){
      pInfo->aColl[i-iStart] = sqlite3ExprNNCollSeq(pParse, pItem->pExpr);
      pInfo->aSortFlags[i-iStart] = pItem->fg.sortFlags;
    }
  }
  return pInfo;
}